

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O2

bool __thiscall mcsFile::toHex(mcsFile *this,char *p2,uchar *result)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  uint i;
  ulong uVar5;
  
  *result = '\0';
  bVar3 = 4;
  bVar4 = 0;
  for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
    bVar1 = p2[uVar5] - 0x30;
    if (9 < bVar1) {
      iVar2 = toupper((int)p2[uVar5]);
      if ((byte)((char)iVar2 + 0xb9U) < 0xfa) break;
      bVar1 = (char)iVar2 - 0x37;
    }
    bVar4 = bVar4 | bVar1 << (bVar3 & 0x1f);
    *result = bVar4;
    bVar3 = bVar3 - 4;
  }
  return 1 < uVar5;
}

Assistant:

bool mcsFile::toHex(const char *p2, unsigned char &result) const
{
    const unsigned int NUM_DIGITS = 2;
    unsigned char digit[NUM_DIGITS];
    result = 0;
    for (unsigned int i = 0; i < NUM_DIGITS; i++) {
        digit[i] = p2[i]-'0';
        if (digit[i] > 9) {
            digit[i] = toupper(p2[i])-'A';
            if (digit[i] > 5) return false;
            digit[i] += 10;
        }
        result |= digit[i] << (4*(NUM_DIGITS-i-1));
    }
    return true;
}